

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

bool WScriptJsrt::PrintException(LPCSTR fileName,JsErrorCode jsErrorCode,JsValueRef exception)

{
  bool bVar1;
  JsErrorCode JVar2;
  LPCWSTR pWVar3;
  PAL_FILE *pPVar4;
  LPWSTR pWVar5;
  bool bVar6;
  char *_Path;
  char local_2c8 [8];
  CHAR ext [256];
  JsPropertyIdRef exceptionId;
  undefined1 auStack_b8 [8];
  AutoString errorMessage;
  JsPropertyIdRef messagePropertyId;
  int local_70;
  int local_6c;
  int line;
  int column;
  JsPropertyIdRef columnPropertyId;
  JsValueRef columnProperty;
  JsValueRef metaData;
  JsValueRef message;
  JsValueRef exception_local;
  JsPropertyIdRef linePropertyId;
  JsValueRef lineProperty;
  bool hasException;
  
  message = exception;
  pWVar3 = ConvertErrorCodeToMessage(jsErrorCode);
  columnProperty = (JsValueRef)0x0;
  if (exception == (JsValueRef)0x0) {
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata)
                      (&columnProperty);
    if (JVar2 == JsNoError) {
      ext[0xf8] = '\0';
      ext[0xf9] = '\0';
      ext[0xfa] = '\0';
      ext[0xfb] = '\0';
      ext[0xfc] = '\0';
      ext[0xfd] = '\0';
      ext[0xfe] = '\0';
      ext[0xff] = '\0';
      JVar2 = CreatePropertyIdFromString("exception",(JsPropertyIdRef *)(ext + 0xf8));
      if (JVar2 != JsNoError) {
        return false;
      }
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                        (columnProperty,(JsPropertyIdRef)ext._248_8_,&message);
    }
    else {
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearException)(&message);
    }
    if (JVar2 != JsNoError) {
      return false;
    }
  }
  if (HostConfigFlags::flags.MuteHostErrorMsgIsEnabled != false) {
    return false;
  }
  if (message == (JsValueRef)0x0) {
    pPVar4 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar4,L"Error : %ls\n",pWVar3);
    return false;
  }
  if (1 < jsErrorCode - JsErrorScriptException) {
    pPVar4 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar4,L"Error : %ls\n",pWVar3);
    return true;
  }
  errorMessage.data._0_5_ = 0;
  errorMessage._13_8_ = 0;
  auStack_b8 = (undefined1  [8])0x0;
  errorMessage.length._0_5_ = 0;
  errorMessage.length._5_3_ = 0;
  JVar2 = AutoString::Initialize((AutoString *)auStack_b8,message);
  if (JVar2 == JsNoError) {
    if (jsErrorCode == JsErrorScriptCompile) {
LAB_001118ce:
      errorMessage.errorCode = JsNoError;
      errorMessage.dontFree = false;
      errorMessage._29_3_ = 0;
      metaData = (JsValueRef)0x0;
      exception_local = (JsValueRef)0x0;
      linePropertyId = (JsPropertyIdRef)0x0;
      JVar2 = CreatePropertyIdFromString("line",(JsPropertyIdRef *)&errorMessage.errorCode);
      if (((JVar2 != JsNoError) ||
          (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                             (message,(JsPropertyIdRef)errorMessage._24_8_,&metaData),
          JVar2 != JsNoError)) ||
         ((JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(metaData,&line),
          JVar2 != JsNoError ||
          (((JVar2 = CreatePropertyIdFromString("column",&exception_local), JVar2 != JsNoError ||
            (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                               (message,exception_local,&linePropertyId), JVar2 != JsNoError)) ||
           (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                              (linePropertyId,(int *)&columnPropertyId), JVar2 != JsNoError))))))
      goto LAB_0011196e;
      _splitpath_s(fileName,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
      pPVar4 = PAL_get_stderr(0);
      pWVar5 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
      PAL_fwprintf(pPVar4,L"%ls\n\tat code (%S%S:%d:%d)\n",pWVar5,ext + 0xf8,local_2c8,
                   (ulong)(line + 1),(ulong)((int)columnPropertyId + 1));
      bVar1 = true;
    }
    else {
      linePropertyId = (JsPropertyIdRef)((ulong)linePropertyId & 0xffffffff00000000);
      metaData = (JsValueRef)0x0;
      exception_local = (JsValueRef)0x0;
      errorMessage.errorCode = JsNoError;
      errorMessage.dontFree = false;
      errorMessage._29_3_ = 0;
      JVar2 = CreatePropertyIdFromString("stack",&metaData);
      if ((((JVar2 == JsNoError) &&
           (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                              (message,metaData,&exception_local), JVar2 == JsNoError)) &&
          (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetValueType)
                             (exception_local,(JsValueType *)&linePropertyId), JVar2 == JsNoError))
         && ((int)linePropertyId != 0)) {
        JVar2 = AutoString::Initialize((AutoString *)&errorMessage.errorCode,exception_local);
        if (JVar2 == JsNoError) {
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = AutoString::GetWideString
                             ((AutoString *)&errorMessage.errorCode,(charcount_t *)0x0);
          bVar1 = true;
          PAL_fwprintf(pPVar4,L"%ls\n",pWVar5);
        }
        else {
          bVar1 = false;
        }
      }
      else {
        _Path = "(unknown)";
        if (fileName != (LPCSTR)0x0) {
          _Path = fileName;
        }
        _splitpath_s(_Path,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
        pPVar4 = PAL_get_stderr(0);
        PAL_fprintf(pPVar4,"thrown at %s%s:\n^\n",ext + 0xf8,local_2c8);
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
        PAL_fwprintf(pPVar4,L"%ls\n",pWVar5);
        bVar1 = true;
      }
      AutoString::~AutoString((AutoString *)&errorMessage.errorCode);
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar4,L"ERROR attempting to coerce error to string, using alternate handler\n");
    lineProperty._7_1_ = '\0';
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtHasException)((bool *)((long)&lineProperty + 7));
    if (lineProperty._7_1_ == '\x01') {
      ext[0xf8] = '\0';
      ext[0xf9] = '\0';
      ext[0xfa] = '\0';
      ext[0xfb] = '\0';
      ext[0xfc] = '\0';
      ext[0xfd] = '\0';
      ext[0xfe] = '\0';
      ext[0xff] = '\0';
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearException)((JsValueRef *)(ext + 0xf8));
    }
    errorMessage.errorCode = JsNoError;
    errorMessage.dontFree = false;
    errorMessage._29_3_ = 0;
    JVar2 = CreatePropertyIdFromString("message",(JsPropertyIdRef *)&errorMessage.errorCode);
    if (JVar2 == JsNoError) {
      metaData = (JsValueRef)0x0;
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                        (message,(JsPropertyIdRef)errorMessage._24_8_,&metaData);
      if ((JVar2 == JsNoError) &&
         (JVar2 = AutoString::Initialize((AutoString *)auStack_b8,metaData), JVar2 == JsNoError)) {
        if (jsErrorCode == JsErrorScriptCompile) goto LAB_001118ce;
        _splitpath_s(fileName,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
        if (columnProperty == (JsValueRef)0x0) {
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
          bVar6 = true;
          PAL_fwprintf(pPVar4,L"%ls\n\tat code (%S%S:??:??)\n",pWVar5,ext + 0xf8,local_2c8);
        }
        else {
          exception_local = (JsValueRef)0x0;
          linePropertyId = (JsPropertyIdRef)0x0;
          _line = (JsPropertyIdRef)0x0;
          columnPropertyId = (JsPropertyIdRef)0x0;
          JVar2 = CreatePropertyIdFromString("line",&exception_local);
          if (((JVar2 != JsNoError) ||
              (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                 (columnProperty,exception_local,&linePropertyId),
              JVar2 != JsNoError)) ||
             (((JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                                  (linePropertyId,&local_70), JVar2 != JsNoError ||
               ((JVar2 = CreatePropertyIdFromString("column",(JsPropertyIdRef *)&line),
                JVar2 != JsNoError ||
                (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                   (columnProperty,_line,&columnPropertyId), JVar2 != JsNoError))))
              || (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                                    (columnPropertyId,&local_6c), JVar2 != JsNoError))))
          goto LAB_0011180b;
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
          PAL_fwprintf(pPVar4,L"%ls\n        at code (%S%S:%d:%d)\n",pWVar5,ext + 0xf8,local_2c8,
                       (ulong)(local_70 + 1),(ulong)(local_6c + 1));
          bVar6 = true;
        }
      }
      else {
LAB_0011180b:
        bVar6 = false;
      }
      bVar1 = false;
      goto LAB_00111a6a;
    }
LAB_0011196e:
    bVar1 = false;
  }
  bVar6 = false;
LAB_00111a6a:
  AutoString::~AutoString((AutoString *)auStack_b8);
  if (bVar1) {
    return true;
  }
  return bVar6;
}

Assistant:

bool WScriptJsrt::PrintException(LPCSTR fileName, JsErrorCode jsErrorCode, JsValueRef exception)
{
    LPCWSTR errorTypeString = ConvertErrorCodeToMessage(jsErrorCode);
    JsValueRef metaData = JS_INVALID_REFERENCE;

    if (exception == nullptr)
    {
        if (ChakraRTInterface::JsGetAndClearExceptionWithMetadata(&metaData) == JsNoError)
        {
            JsPropertyIdRef exceptionId = JS_INVALID_REFERENCE;
            IfJsrtErrorFail(CreatePropertyIdFromString("exception", &exceptionId), false);
            IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, exceptionId, &exception), false);
        }
        else
        {
            IfJsrtErrorFail(ChakraRTInterface::JsGetAndClearException(&exception), false);
        }

    }

    if (HostConfigFlags::flags.MuteHostErrorMsgIsEnabled)
    {
        return false;
    }

    if (exception != nullptr)
    {
        if (jsErrorCode == JsErrorCode::JsErrorScriptCompile || jsErrorCode == JsErrorCode::JsErrorScriptException)
        {
            AutoString errorMessage;

            if (errorMessage.Initialize(exception) != JsNoError)
            {
                fwprintf(stderr, _u("ERROR attempting to coerce error to string, using alternate handler\n"));
                bool hasException = false;
                ChakraRTInterface::JsHasException(&hasException);
                if (hasException)
                {
                    JsValueRef throwAway = JS_INVALID_REFERENCE;
                    ChakraRTInterface::JsGetAndClearException(&throwAway);
                }
                JsPropertyIdRef messagePropertyId = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(CreatePropertyIdFromString("message", &messagePropertyId), false);
                JsValueRef message = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, messagePropertyId, &message), false);
                IfJsrtErrorFail(errorMessage.Initialize(message), false);

                if (jsErrorCode != JsErrorCode::JsErrorScriptCompile)
                {
                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    if (metaData != JS_INVALID_REFERENCE)
                    {
                        JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                        JsValueRef lineProperty = JS_INVALID_REFERENCE;

                        JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                        JsValueRef columnProperty = JS_INVALID_REFERENCE;
                        
                        int line;
                        int column;
                        
                        IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, linePropertyId, &lineProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                        IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, columnPropertyId, &columnProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);
                        fwprintf(stderr, _u("%ls\n        at code (%S%S:%d:%d)\n"),
                            errorMessage.GetWideString(), shortFileName, ext, line + 1, column + 1);
                    }
                    else
                    {
                        fwprintf(stderr, _u("%ls\n\tat code (%S%S:\?\?:\?\?)\n"), errorMessage.GetWideString(), shortFileName, ext);
                    }
                    return true;
                }
            }

            if (jsErrorCode == JsErrorCode::JsErrorScriptCompile)
            {
                JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                JsValueRef lineProperty = JS_INVALID_REFERENCE;

                JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                JsValueRef columnProperty = JS_INVALID_REFERENCE;

                int line;
                int column;
                
                IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, linePropertyId, &lineProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, columnPropertyId, &columnProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);

                CHAR shortFileName[_MAX_PATH];
                CHAR ext[_MAX_EXT];
                _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));
                fwprintf(stderr, _u("%ls\n\tat code (%S%S:%d:%d)\n"),
                    errorMessage.GetWideString(), shortFileName, ext, (int)line + 1,
                    (int)column + 1);
            }
            else
            {
                JsValueType propertyType = JsUndefined;
                JsPropertyIdRef stackPropertyId = JS_INVALID_REFERENCE;
                JsValueRef stackProperty = JS_INVALID_REFERENCE;
                AutoString errorStack;

                JsErrorCode errorCode = CreatePropertyIdFromString("stack", &stackPropertyId);

                if (errorCode == JsErrorCode::JsNoError)
                {
                    errorCode = ChakraRTInterface::JsGetProperty(exception, stackPropertyId, &stackProperty);
                    if (errorCode == JsErrorCode::JsNoError)
                    {
                        errorCode = ChakraRTInterface::JsGetValueType(stackProperty, &propertyType);
                    }
                }

                if (errorCode != JsErrorCode::JsNoError || propertyType == JsUndefined)
                {
                    const char *fName = fileName != nullptr ? fileName : "(unknown)";

                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    // do not mix char/wchar. print them separately
                    fprintf(stderr, "thrown at %s%s:\n^\n", shortFileName, ext);
                    fwprintf(stderr, _u("%ls\n"), errorMessage.GetWideString());
                }
                else
                {
                    IfJsrtErrorFail(errorStack.Initialize(stackProperty), false);
                    fwprintf(stderr, _u("%ls\n"), errorStack.GetWideString());
                }
            }
        }
        else
        {
            fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
        }
        return true;
    }
    else
    {
        fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
    }
    return false;
}